

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
::logAndSetTestResult
          (ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
           *this,vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                 *results)

{
  TestContext *pTVar1;
  float fVar2;
  undefined8 uVar3;
  TestLog *log;
  char *pcVar4;
  int precision;
  float fVar5;
  UploadSampleAnalyzeResult UVar6;
  string local_88;
  string local_58;
  UploadSampleAnalyzeResult local_38;
  undefined8 local_24;
  UploadSampleAnalyzeResult analysis;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
  *results_local;
  ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  *this_local;
  
  analysis._4_8_ = results;
  log = tcu::TestContext::getLog
                  ((this->
                   super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                   ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  UVar6 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                    (log,(vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                          *)analysis._4_8_,false);
  local_38._0_8_ = UVar6._0_8_;
  local_24._0_4_ = local_38.transferRateMedian;
  local_24._4_4_ = local_38.transferRateAtRange;
  uVar3 = local_24;
  local_38.transferRateAtInfinity = UVar6.transferRateAtInfinity;
  analysis.transferRateMedian = local_38.transferRateAtInfinity;
  local_24._0_4_ = UVar6.transferRateMedian;
  fVar2 = (float)local_24;
  local_38 = UVar6;
  local_24 = uVar3;
  fVar5 = std::numeric_limits<float>::infinity();
  if ((fVar2 != fVar5) || (NAN(fVar2) || NAN(fVar5))) {
    pTVar1 = (this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
             ).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_
              (&local_88,(de *)0x2,(float)local_24 * 0.0009765625 * 0.0009765625,precision);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_PASS,pcVar4);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    pTVar1 = (this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
             ).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_(&local_58,(de *)0x2,0.0,precision);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_PASS,pcVar4);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void ModifyAfterBasicCase<SampleType>::logAndSetTestResult (const std::vector<UploadSampleResult<SampleType> >& results)
{
	const UploadSampleAnalyzeResult analysis = analyzeSampleResults(m_testCtx.getLog(), results, false);

	// Return median transfer rate of the samples

	if (analysis.transferRateMedian == std::numeric_limits<float>::infinity())
	{
		// sample times are 1) invalid or 2) timer resolution too low
		// report speed 0 bytes / s since real value cannot be determined
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
	}
	else
	{
		// report transfer rate in MB / s
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(analysis.transferRateMedian / 1024.0f / 1024.0f, 2).c_str());
	}
}